

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testFun.cpp
# Opt level: O0

void testd(double d,bool changeExpected)

{
  uint uVar1;
  unsigned_long uVar2;
  unsigned_long uVar3;
  byte in_DIL;
  double in_XMM0_Qa;
  double from;
  double from_00;
  double dVar4;
  double dVar5;
  double psd;
  double spd;
  double pd;
  double sd;
  
  printf("\n");
  from = (double)Imath_3_2::succd(in_XMM0_Qa);
  from_00 = (double)Imath_3_2::predd(in_XMM0_Qa);
  dVar4 = (double)Imath_3_2::predd(in_XMM0_Qa);
  dVar4 = (double)Imath_3_2::succd(dVar4);
  dVar5 = (double)Imath_3_2::succd(in_XMM0_Qa);
  dVar5 = (double)Imath_3_2::predd(dVar5);
  uVar2 = bit_cast<unsigned_long,double>(in_XMM0_Qa);
  printf("d   %0.18lg %lx\n",in_XMM0_Qa,uVar2);
  uVar2 = bit_cast<unsigned_long,double>(from);
  printf("sd  %0.18lg %lx\n",from,uVar2);
  uVar2 = bit_cast<unsigned_long,double>(from_00);
  printf("pd  %0.18lg %lx\n",from_00,uVar2);
  uVar2 = bit_cast<unsigned_long,double>(dVar4);
  printf("spd %0.18lg %lx\n",dVar4,uVar2);
  uVar2 = bit_cast<unsigned_long,double>(dVar5);
  printf("psd %0.18lg %lx\n",dVar5,uVar2);
  fflush(_stdout);
  if ((in_DIL & 1) == 0) {
    uVar1 = std::isnan(in_XMM0_Qa);
    if ((uVar1 & 1) == 0) {
      uVar2 = bit_cast<unsigned_long,double>(from_00);
      uVar3 = bit_cast<unsigned_long,double>(in_XMM0_Qa);
      if (uVar2 != uVar3) {
        __assert_fail("bit_cast<uint64_t> (pd) == bit_cast<uint64_t> (d)",
                      "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]Imath/src/ImathTest/testFun.cpp"
                      ,0x77,"void testd(double, bool)");
      }
      uVar2 = bit_cast<unsigned_long,double>(from);
      uVar3 = bit_cast<unsigned_long,double>(in_XMM0_Qa);
      if (uVar2 != uVar3) {
        __assert_fail("bit_cast<uint64_t> (sd) == bit_cast<uint64_t> (d)",
                      "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]Imath/src/ImathTest/testFun.cpp"
                      ,0x78,"void testd(double, bool)");
      }
    }
    else {
      uVar1 = std::isnan(from_00);
      if ((uVar1 & 1) == 0) {
        __assert_fail("isnan (pd)",
                      "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]Imath/src/ImathTest/testFun.cpp"
                      ,0x71,"void testd(double, bool)");
      }
      uVar1 = std::isnan(from);
      if ((uVar1 & 1) == 0) {
        __assert_fail("isnan (sd)",
                      "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]Imath/src/ImathTest/testFun.cpp"
                      ,0x72,"void testd(double, bool)");
      }
    }
  }
  else {
    if (in_XMM0_Qa <= from_00) {
      __assert_fail("pd < d",
                    "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]Imath/src/ImathTest/testFun.cpp"
                    ,0x68,"void testd(double, bool)");
    }
    if (from <= in_XMM0_Qa) {
      __assert_fail("d < sd",
                    "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]Imath/src/ImathTest/testFun.cpp"
                    ,0x69,"void testd(double, bool)");
    }
  }
  return;
}

Assistant:

void
testd (double d, bool changeExpected = true)
{
    printf ("\n");

    double sd = IMATH_INTERNAL_NAMESPACE::succd (d);
    double pd = IMATH_INTERNAL_NAMESPACE::predd (d);
    double spd =
        IMATH_INTERNAL_NAMESPACE::succd (IMATH_INTERNAL_NAMESPACE::predd (d));
    double psd =
        IMATH_INTERNAL_NAMESPACE::predd (IMATH_INTERNAL_NAMESPACE::succd (d));

    printf ("d   %0.18lg %" PRIx64 "\n", d, bit_cast<uint64_t> (d));
    printf ("sd  %0.18lg %" PRIx64 "\n", sd, bit_cast<uint64_t> (sd));
    printf ("pd  %0.18lg %" PRIx64 "\n", pd, bit_cast<uint64_t> (pd));
    printf ("spd %0.18lg %" PRIx64 "\n", spd, bit_cast<uint64_t> (spd));
    printf ("psd %0.18lg %" PRIx64 "\n", psd, bit_cast<uint64_t> (psd));

    fflush (stdout);

    if (changeExpected)
    {
        assert (pd < d);
        assert (d < sd);
    }
    else
    {
        if (isnan (d))
        {
            // If f is nan, pf and sf may be converted from signaling
            // to quiet nan, but they'll still be nan's.
            assert (isnan (pd));
            assert (isnan (sd));
        }
        else
        {
            // No bit change expected if input was inf.
            assert (bit_cast<uint64_t> (pd) == bit_cast<uint64_t> (d));
            assert (bit_cast<uint64_t> (sd) == bit_cast<uint64_t> (d));
        }
    }
}